

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPolyLoop::IfcPolyLoop(IfcPolyLoop *this)

{
  IfcPolyLoop *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x58,"IfcPolyLoop");
  IfcLoop::IfcLoop(&this->super_IfcLoop,&PTR_construction_vtable_24__010d1988);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPolyLoop,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcPolyLoop,_1UL> *)
             &(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.field_0x30,
             &PTR_construction_vtable_24__010d1a00);
  (this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x10d18d0;
  *(undefined8 *)&this->field_0x58 = 0x10d1970;
  *(undefined8 *)
   &(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x10d18f8;
  *(undefined8 *)
   &(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x10d1920;
  *(undefined8 *)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.field_0x30 =
       0x10d1948;
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_3UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_3UL,_0UL> *)
             &(this->super_IfcLoop).field_0x40);
  return;
}

Assistant:

IfcPolyLoop() : Object("IfcPolyLoop") {}